

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_2> * tcu::operator*(Matrix<float,_4,_2> *a,Matrix<float,_2,_2> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<float,_4> *pVVar7;
  long lVar8;
  Matrix<float,_4,_2> *res;
  Matrix<float,_4,_2> *in_RDI;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 1.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = 1.0;
  pVVar7 = (in_RDI->m_data).m_data;
  pVVar7[1].m_data[2] = 0.0;
  pVVar7[1].m_data[3] = 0.0;
  fVar1 = (b->m_data).m_data[0].m_data[0];
  fVar2 = (b->m_data).m_data[0].m_data[1];
  fVar3 = (b->m_data).m_data[1].m_data[0];
  fVar4 = (b->m_data).m_data[1].m_data[1];
  lVar8 = -4;
  do {
    fVar5 = (a->m_data).m_data[1].m_data[lVar8];
    fVar6 = a[1].m_data.m_data[0].m_data[lVar8];
    (in_RDI->m_data).m_data[1].m_data[lVar8] = fVar6 * fVar2 + fVar5 * fVar1 + 0.0;
    in_RDI[1].m_data.m_data[0].m_data[lVar8] = fVar6 * fVar4 + fVar5 * fVar3 + 0.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0);
  return in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}